

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavelib.c
# Opt level: O2

void dwpt_per(wpt_object wt,double *inp,int N,double *cA,int len_cA,double *cD)

{
  wave_object pwVar1;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  double *pdVar11;
  int iVar12;
  ulong uVar13;
  uint uVar14;
  double dVar15;
  
  pwVar1 = wt->wave;
  uVar14 = pwVar1->lpd_len;
  uVar3 = (long)(int)uVar14 / 2 & 0xffffffff;
  iVar4 = N % 2;
  uVar13 = 0;
  uVar5 = (ulong)uVar14;
  if ((int)uVar14 < 1) {
    uVar5 = uVar13;
  }
  uVar8 = (ulong)(uint)len_cA;
  if (len_cA < 1) {
    uVar8 = uVar13;
  }
  iVar10 = (int)((long)(int)uVar14 / 2);
  iVar6 = iVar10 - N;
  iVar12 = iVar10 + 1;
  do {
    if (uVar13 == uVar8) {
      return;
    }
    cA[uVar13] = 0.0;
    cD[uVar13] = 0.0;
    uVar14 = (uint)uVar3;
    for (uVar2 = 0; uVar5 != uVar2; uVar2 = uVar2 + 1) {
      if ((int)uVar14 < N && iVar10 <= (int)uVar14) {
        dVar15 = pwVar1->lpd[uVar2];
        uVar9 = (ulong)(int)uVar14;
LAB_00104b0f:
        pdVar11 = inp + uVar9;
LAB_00104b13:
        cA[uVar13] = dVar15 * *pdVar11 + cA[uVar13];
        cD[uVar13] = pwVar1->hpd[uVar2] * *pdVar11 + cD[uVar13];
      }
      else {
        if (-1 < (int)uVar14 && (int)uVar14 < iVar10) {
          dVar15 = pwVar1->lpd[uVar2];
          uVar9 = (ulong)uVar14;
          goto LAB_00104b0f;
        }
        if ((iVar4 == 0) && ((int)uVar14 < 0)) {
          dVar15 = pwVar1->lpd[uVar2];
          iVar7 = N + uVar14;
          goto LAB_00104b0c;
        }
        pdVar11 = inp + (long)N + -1;
        if ((iVar4 == 1) && ((int)uVar14 < 0)) {
          dVar15 = pwVar1->lpd[uVar2];
          if (iVar12 != (int)uVar2) {
            pdVar11 = inp + (long)(int)(N + uVar14) + 1;
          }
          goto LAB_00104b13;
        }
        if ((iVar4 == 0) && (N <= (int)uVar14)) {
          dVar15 = pwVar1->lpd[uVar2];
          iVar7 = -N + uVar14;
LAB_00104b0c:
          uVar9 = (ulong)iVar7;
          goto LAB_00104b0f;
        }
        if ((iVar4 == 1) && (N <= (int)uVar14)) {
          dVar15 = pwVar1->lpd[uVar2];
          if (iVar6 == (int)uVar2) goto LAB_00104b13;
          iVar7 = -N + uVar14 + -1;
          goto LAB_00104b0c;
        }
      }
      uVar14 = uVar14 - 1;
    }
    uVar13 = uVar13 + 1;
    uVar3 = (ulong)((uint)uVar3 + 2);
    iVar6 = iVar6 + 2;
    iVar12 = iVar12 + 2;
  } while( true );
}

Assistant:

static void dwpt_per(wpt_object wt, double *inp, int N, double *cA, int len_cA, double *cD) {
	int l, l2, isodd, i, t, len_avg;

	len_avg = wt->wave->lpd_len;
	l2 = len_avg / 2;
	isodd = N % 2;

	for (i = 0; i < len_cA; ++i) {
		t = 2 * i + l2;
		cA[i] = 0.0;
		cD[i] = 0.0;
		for (l = 0; l < len_avg; ++l) {
			if ((t - l) >= l2 && (t - l) < N) {
				cA[i] += wt->wave->lpd[l] * inp[t - l];
				cD[i] += wt->wave->hpd[l] * inp[t - l];
			}
			else if ((t - l) < l2 && (t - l) >= 0) {
				cA[i] += wt->wave->lpd[l] * inp[t - l];
				cD[i] += wt->wave->hpd[l] * inp[t - l];
			}
			else if ((t - l) < 0 && isodd == 0) {
				cA[i] += wt->wave->lpd[l] * inp[t - l + N];
				cD[i] += wt->wave->hpd[l] * inp[t - l + N];
			}
			else if ((t - l) < 0 && isodd == 1) {
				if ((t - l) != -1) {
					cA[i] += wt->wave->lpd[l] * inp[t - l + N + 1];
					cD[i] += wt->wave->hpd[l] * inp[t - l + N + 1];
				}
				else {
					cA[i] += wt->wave->lpd[l] * inp[N - 1];
					cD[i] += wt->wave->hpd[l] * inp[N - 1];
				}
			}
			else if ((t - l) >= N && isodd == 0) {
				cA[i] += wt->wave->lpd[l] * inp[t - l - N];
				cD[i] += wt->wave->hpd[l] * inp[t - l - N];
			}
			else if ((t - l) >= N && isodd == 1) {
				if (t - l != N) {
					cA[i] += wt->wave->lpd[l] * inp[t - l - (N + 1)];
					cD[i] += wt->wave->hpd[l] * inp[t - l - (N + 1)];
				}
				else {
					cA[i] += wt->wave->lpd[l] * inp[N - 1];
					cD[i] += wt->wave->hpd[l] * inp[N - 1];
				}
			}

		}
	}



}